

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

int __thiscall cs::compiler_type::get_signal_level(compiler_type *this,token_base *ptr)

{
  int iVar1;
  int *piVar2;
  compile_error *pcVar3;
  allocator local_31;
  string local_30;
  
  if (ptr == (token_base *)0x0) {
    pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"Get the level of null token.",&local_31);
    compile_error::compile_error(pcVar3,&local_30);
    __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  iVar1 = (*ptr->_vptr_token_base[2])(ptr);
  if (iVar1 == 3) {
    local_30._M_dataplus._M_p._0_4_ = *(undefined4 *)&ptr[1]._vptr_token_base;
    piVar2 = mapping<cs::signal_types,_int>::match
                       ((mapping<cs::signal_types,_int> *)signal_level_map,(signal_types *)&local_30
                       );
    return *piVar2;
  }
  pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Get the level of non-signal token.",&local_31);
  compile_error::compile_error(pcVar3,&local_30);
  __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

int get_signal_level(token_base *ptr)
		{
			if (ptr == nullptr)
				throw compile_error("Get the level of null token.");
			if (ptr->get_type() != token_types::signal)
				throw compile_error("Get the level of non-signal token.");
			return signal_level_map.match(static_cast<token_signal *>(ptr)->get_signal());
		}